

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.upb.h
# Opt level: O2

google_protobuf_FileDescriptorProto **
google_protobuf_compiler_CodeGeneratorRequest_proto_file
          (google_protobuf_compiler_CodeGeneratorRequest *msg,size_t *size)

{
  upb_Array *puVar1;
  google_protobuf_FileDescriptorProto **ppgVar2;
  upb_MiniTableField field;
  upb_MiniTableField local_18;
  
  local_18.number_dont_copy_me__upb_internal_use_only = 0xf;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x30;
  local_18.presence = 0;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 1;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  puVar1 = upb_Message_GetArray(&msg->base_dont_copy_me__upb_internal_use_only,&local_18);
  if (puVar1 == (upb_Array *)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    ppgVar2 = (google_protobuf_FileDescriptorProto **)0x0;
  }
  else {
    if (size != (size_t *)0x0) {
      *size = puVar1->size_dont_copy_me__upb_internal_use_only;
    }
    ppgVar2 = (google_protobuf_FileDescriptorProto **)
              (puVar1->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return ppgVar2;
}

Assistant:

UPB_INLINE const struct google_protobuf_FileDescriptorProto* const* google_protobuf_compiler_CodeGeneratorRequest_proto_file(const google_protobuf_compiler_CodeGeneratorRequest* msg, size_t* size) {
  const upb_MiniTableField field = {15, UPB_SIZE(20, 48), 0, 1, 11, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&google__protobuf__FileDescriptorProto_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const struct google_protobuf_FileDescriptorProto* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}